

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

int context_increase(dmr_C *C,basic_block *bb,int entry)

{
  int iVar1;
  int current;
  int val;
  ptr_list_iter insniter__;
  instruction *insn;
  int sum;
  int entry_local;
  basic_block *bb_local;
  dmr_C *C_local;
  
  insn._0_4_ = 0;
  ptrlist_forward_iterator(&current,bb->insns);
  insniter__._16_8_ = ptrlist_iter_next(&current);
  do {
    if (insniter__._16_8_ == 0) {
      return (int)insn;
    }
    if ((*(uint *)insniter__._16_8_ & 0xff) == 0x3e) {
      iVar1 = *(int *)(insniter__._16_8_ + 0x28);
      if (*(int *)(insniter__._16_8_ + 0x2c) == 0) {
        insn._0_4_ = iVar1 + (int)insn;
      }
      else if (iVar1 == 0) {
        if ((int)insn + entry != 0) {
LAB_00101c6e:
          dmrC_warning(C,*(undefined8 *)(insniter__._16_8_ + 0x10),"context check failure");
        }
      }
      else if ((int)insn + entry < iVar1) goto LAB_00101c6e;
    }
    insniter__._16_8_ = ptrlist_iter_next(&current);
  } while( true );
}

Assistant:

static int context_increase(struct dmr_C *C, struct basic_block *bb, int entry)
{
	int sum = 0;
	struct instruction *insn;

	FOR_EACH_PTR(bb->insns, insn) {
		int val;
		if (insn->opcode != OP_CONTEXT)
			continue;
		val = insn->increment;
		if (insn->check) {
			int current = sum + entry;
			if (!val) {
				if (!current)
					continue;
			} else if (current >= val)
				continue;
			dmrC_warning(C, insn->pos, "context check failure");
			continue;
		}
		sum += val;
	} END_FOR_EACH_PTR(insn);
	return sum;
}